

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragmentOutputTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::FragmentOutputCase::init(FragmentOutputCase *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  TestLog *log;
  Context *pCVar2;
  RenderContext *renderCtx;
  pointer puVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  int extraout_EAX;
  undefined4 extraout_var;
  NotSupportedError *pNVar8;
  ostream *poVar9;
  char *pcVar10;
  char *pcVar11;
  ShaderProgram *this_00;
  MessageBuilder *pMVar12;
  TestError *this_01;
  size_t __n;
  void *__buf;
  int outNdx_1;
  pointer pBVar13;
  pointer pFVar14;
  int elemNdx;
  pointer_____offset_0x10___ *ppuVar15;
  char *pcVar16;
  long lVar17;
  int outNdx;
  int iVar18;
  int iVar19;
  long lVar20;
  char *pcVar21;
  int bufNdx;
  string local_438;
  string local_418;
  ostringstream vtx;
  ostringstream local_3f0 [376];
  ostringstream frag;
  ProgramSources local_100;
  long lVar7;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  pBVar13 = (this->m_fboSpec).
            super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
            ._M_impl.super__Vector_impl_data._M_start;
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  while( true ) {
    pCVar2 = (this->super_TestCase).m_context;
    renderCtx = pCVar2->m_renderCtx;
    if (pBVar13 ==
        (this->m_fboSpec).
        super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
        ._M_impl.super__Vector_impl_data._M_finish) break;
    bVar4 = glu::isSizedFormatColorRenderable(renderCtx,pCVar2->m_contextInfo,pBVar13->format);
    pBVar13 = pBVar13 + 1;
    if (!bVar4) {
      pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&vtx,"Unsupported attachment format",(allocator<char> *)&frag);
      tcu::NotSupportedError::NotSupportedError(pNVar8,(string *)&vtx);
      __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
  poVar9 = std::operator<<((ostream *)&vtx,"#version 300 es\n");
  std::operator<<(poVar9,"in highp vec4 a_position;\n");
  std::operator<<((ostream *)&frag,"#version 300 es\n");
  for (lVar20 = 0;
      pFVar14 = (this->m_outputs).
                super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                ._M_impl.super__Vector_impl_data._M_start,
      lVar20 < (int)((ulong)((long)(this->m_outputs).
                                   super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar14) >> 4)
      ; lVar20 = lVar20 + 1) {
    iVar5 = pFVar14[lVar20].arrayLength;
    pcVar10 = glu::getDataTypeName(pFVar14[lVar20].type);
    pFVar14 = pFVar14 + lVar20;
    pcVar11 = glu::getPrecisionName(pFVar14->precision);
    pcVar21 = "flat";
    pcVar16 = pcVar11;
    if (pFVar14->type - TYPE_FLOAT < 4) {
      pcVar21 = "smooth";
      pcVar16 = "highp";
    }
    iVar18 = (int)lVar20;
    if (iVar5 < 1) {
      poVar9 = std::operator<<((ostream *)&vtx,"in ");
      poVar9 = std::operator<<(poVar9,pcVar16);
      poVar9 = std::operator<<(poVar9," ");
      poVar9 = std::operator<<(poVar9,pcVar10);
      poVar9 = std::operator<<(poVar9," in");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar18);
      poVar9 = std::operator<<(poVar9,";\n");
      poVar9 = std::operator<<(poVar9,pcVar21);
      poVar9 = std::operator<<(poVar9," out ");
      poVar9 = std::operator<<(poVar9,pcVar16);
      poVar9 = std::operator<<(poVar9," ");
      poVar9 = std::operator<<(poVar9,pcVar10);
      poVar9 = std::operator<<(poVar9," var");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar18);
      std::operator<<(poVar9,";\n");
      poVar9 = std::operator<<((ostream *)&frag,pcVar21);
      poVar9 = std::operator<<(poVar9," in ");
      poVar9 = std::operator<<(poVar9,pcVar16);
      poVar9 = std::operator<<(poVar9," ");
      poVar9 = std::operator<<(poVar9,pcVar10);
      poVar9 = std::operator<<(poVar9," var");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar18);
      poVar9 = std::operator<<(poVar9,";\n");
      poVar9 = std::operator<<(poVar9,"layout(location = ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,pFVar14->location);
      poVar9 = std::operator<<(poVar9,") out ");
      poVar9 = std::operator<<(poVar9,pcVar11);
      poVar9 = std::operator<<(poVar9," ");
      poVar9 = std::operator<<(poVar9,pcVar10);
      poVar9 = std::operator<<(poVar9," out");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar18);
      pcVar21 = ";\n";
    }
    else {
      for (iVar5 = 0; iVar5 < pFVar14->arrayLength; iVar5 = iVar5 + 1) {
        poVar9 = std::operator<<((ostream *)&vtx,"in ");
        poVar9 = std::operator<<(poVar9,pcVar16);
        poVar9 = std::operator<<(poVar9," ");
        poVar9 = std::operator<<(poVar9,pcVar10);
        poVar9 = std::operator<<(poVar9," in");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar18);
        poVar9 = std::operator<<(poVar9,"_");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar5);
        poVar9 = std::operator<<(poVar9,";\n");
        poVar9 = std::operator<<(poVar9,pcVar21);
        poVar9 = std::operator<<(poVar9," out ");
        poVar9 = std::operator<<(poVar9,pcVar16);
        poVar9 = std::operator<<(poVar9," ");
        poVar9 = std::operator<<(poVar9,pcVar10);
        poVar9 = std::operator<<(poVar9," var");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar18);
        poVar9 = std::operator<<(poVar9,"_");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar5);
        std::operator<<(poVar9,";\n");
        poVar9 = std::operator<<((ostream *)&frag,pcVar21);
        poVar9 = std::operator<<(poVar9," in ");
        poVar9 = std::operator<<(poVar9,pcVar16);
        poVar9 = std::operator<<(poVar9," ");
        poVar9 = std::operator<<(poVar9,pcVar10);
        poVar9 = std::operator<<(poVar9," var");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar18);
        poVar9 = std::operator<<(poVar9,"_");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar5);
        std::operator<<(poVar9,";\n");
      }
      poVar9 = std::operator<<((ostream *)&frag,"layout(location = ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,pFVar14->location);
      poVar9 = std::operator<<(poVar9,") out ");
      poVar9 = std::operator<<(poVar9,pcVar11);
      poVar9 = std::operator<<(poVar9," ");
      poVar9 = std::operator<<(poVar9,pcVar10);
      poVar9 = std::operator<<(poVar9," out");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar18);
      poVar9 = std::operator<<(poVar9,"[");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,pFVar14->arrayLength);
      pcVar21 = "];\n";
    }
    std::operator<<(poVar9,pcVar21);
  }
  std::operator<<((ostream *)&vtx,"\nvoid main()\n{\n");
  std::operator<<((ostream *)&frag,"\nvoid main()\n{\n");
  std::operator<<((ostream *)&vtx,"\tgl_Position = a_position;\n");
  lVar20 = 0;
  while( true ) {
    pFVar14 = (this->m_outputs).
              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __n = (size_t)(int)((ulong)((long)(this->m_outputs).
                                      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar14) >>
                       4);
    if ((long)__n <= lVar20) break;
    iVar5 = pFVar14[lVar20].arrayLength;
    iVar18 = (int)lVar20;
    if (iVar5 < 1) {
      poVar9 = std::operator<<((ostream *)&vtx,"\tvar");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar18);
      poVar9 = std::operator<<(poVar9," = in");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar18);
      std::operator<<(poVar9,";\n");
      poVar9 = std::operator<<((ostream *)&frag,"\tout");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar18);
      poVar9 = std::operator<<(poVar9," = var");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar18);
      std::operator<<(poVar9,";\n");
    }
    else {
      for (iVar19 = 0; iVar19 < iVar5; iVar19 = iVar19 + 1) {
        poVar9 = std::operator<<((ostream *)&vtx,"\tvar");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar18);
        poVar9 = std::operator<<(poVar9,"_");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar19);
        poVar9 = std::operator<<(poVar9," = in");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar18);
        poVar9 = std::operator<<(poVar9,"_");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar19);
        std::operator<<(poVar9,";\n");
        poVar9 = std::operator<<((ostream *)&frag,"\tout");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar18);
        poVar9 = std::operator<<(poVar9,"[");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar19);
        poVar9 = std::operator<<(poVar9,"] = var");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar18);
        poVar9 = std::operator<<(poVar9,"_");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar19);
        std::operator<<(poVar9,";\n");
        iVar5 = pFVar14[lVar20].arrayLength;
      }
    }
    lVar20 = lVar20 + 1;
  }
  std::operator<<((ostream *)&vtx,"}\n");
  std::operator<<((ostream *)&frag,"}\n");
  this_00 = (ShaderProgram *)operator_new(0xd0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  glu::makeVtxFragSources(&local_100,&local_418,&local_438);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,&local_100);
  glu::ProgramSources::~ProgramSources(&local_100);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
  this->m_program = this_00;
  glu::operator<<(log,this_00);
  if ((this->m_program->m_program).m_info.linkOk == false) {
    pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              ((TestError *)pNVar8,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
               ,0x101);
    ppuVar15 = &tcu::TestError::typeinfo;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&frag,"Framebuffer",(allocator<char> *)&local_418);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"Framebuffer configuration",(allocator<char> *)&local_438);
    tcu::LogSection::LogSection((LogSection *)&vtx,(string *)&frag,(string *)&local_100);
    tcu::LogSection::write((LogSection *)&vtx,(int)log,__buf,__n);
    tcu::LogSection::~LogSection((LogSection *)&vtx);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&frag);
    lVar20 = 8;
    for (lVar17 = 0;
        lVar17 < (int)((ulong)((long)(this->m_fboSpec).
                                     super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_fboSpec).
                                    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4);
        lVar17 = lVar17 + 1) {
      _vtx = (pointer)log;
      std::__cxx11::ostringstream::ostringstream(local_3f0);
      std::operator<<((ostream *)local_3f0,"COLOR_ATTACHMENT");
      std::ostream::operator<<(local_3f0,(int)lVar17);
      std::operator<<((ostream *)local_3f0,": ");
      _frag = glu::getTextureFormatName;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&frag,(ostream *)local_3f0);
      std::operator<<((ostream *)local_3f0,", ");
      pMVar12 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&vtx,
                           (int *)((long)(this->m_fboSpec).
                                         super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar20 + -4));
      std::operator<<((ostream *)&pMVar12->m_str,"x");
      pMVar12 = tcu::MessageBuilder::operator<<
                          (pMVar12,(int *)((long)&((this->m_fboSpec).
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->format
                                          + lVar20));
      std::operator<<((ostream *)&pMVar12->m_str,", ");
      pMVar12 = tcu::MessageBuilder::operator<<
                          (pMVar12,(int *)((long)&((this->m_fboSpec).
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->width
                                          + lVar20));
      std::operator<<((ostream *)&pMVar12->m_str," samples");
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_3f0);
      lVar20 = lVar20 + 0x10;
    }
    tcu::TestLog::endSection(log);
    _vtx = _vtx & 0xffffffff00000000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->m_renderbuffers,
               (long)(this->m_fboSpec).
                     super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_fboSpec).
                     super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4,(value_type_conflict2 *)&vtx);
    (**(code **)(lVar7 + 0x6d0))(1,&this->m_framebuffer);
    (**(code **)(lVar7 + 0x6e8))
              ((ulong)((long)(this->m_renderbuffers).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)(this->m_renderbuffers).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
    (**(code **)(lVar7 + 0x78))(0x8d40,this->m_framebuffer);
    lVar20 = 0xc;
    for (lVar17 = 0;
        puVar3 = (this->m_renderbuffers).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,
        lVar17 < (int)((ulong)((long)(this->m_renderbuffers).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3) >> 2
                      ); lVar17 = lVar17 + 1) {
      uVar1 = puVar3[lVar17];
      pBVar13 = (this->m_fboSpec).
                super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (**(code **)(lVar7 + 0xa0))(0x8d41,uVar1);
      (**(code **)(lVar7 + 0x1240))
                (0x8d41,*(undefined4 *)((long)&pBVar13->format + lVar20),
                 *(undefined4 *)((long)pBVar13 + lVar20 + -0xc),
                 *(undefined4 *)((long)pBVar13 + lVar20 + -8),
                 *(undefined4 *)((long)pBVar13 + lVar20 + -4));
      (**(code **)(lVar7 + 0x688))(0x8d40,(int)lVar17 + 0x8ce0,0x8d41,uVar1);
      lVar20 = lVar20 + 0x10;
    }
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"After framebuffer setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
                    ,0x120);
    iVar5 = (**(code **)(lVar7 + 0x170))(0x8d40);
    if (iVar5 == 0x8cd5) {
      (**(code **)(lVar7 + 0x78))(0x8d40,0);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"After init",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
                      ,0x129);
      return extraout_EAX;
    }
    if (iVar5 != 0x8cdd) {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&frag,"Incomplete framebuffer: ",(allocator<char> *)&local_438);
      local_418._M_dataplus._M_p = (pointer)glu::getFramebufferStatusName;
      local_418._M_string_length._0_4_ = iVar5;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_((string *)&local_100,&local_418);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtx,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frag,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100
                    );
      tcu::TestError::TestError
                (this_01,_vtx,"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
                 ,0x126);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar8,"Framebuffer not supported","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
               ,0x124);
    ppuVar15 = &tcu::NotSupportedError::typeinfo;
  }
  __cxa_throw(pNVar8,ppuVar15,tcu::Exception::~Exception);
}

Assistant:

void FragmentOutputCase::init (void)
{
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	TestLog&				log		= m_testCtx.getLog();

	// Check that all attachments are supported
	for (std::vector<BufferSpec>::const_iterator bufIter = m_fboSpec.begin(); bufIter != m_fboSpec.end(); ++bufIter)
	{
		if (!glu::isSizedFormatColorRenderable(m_context.getRenderContext(), m_context.getContextInfo(), bufIter->format))
			throw tcu::NotSupportedError("Unsupported attachment format");
	}

	DE_ASSERT(!m_program);
	m_program = createProgram(m_context.getRenderContext(), m_outputs);

	log << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Compile failed");

	// Print render target info to log.
	log << TestLog::Section("Framebuffer", "Framebuffer configuration");

	for (int ndx = 0; ndx < (int)m_fboSpec.size(); ndx++)
		log << TestLog::Message << "COLOR_ATTACHMENT" << ndx << ": "
								<< glu::getTextureFormatStr(m_fboSpec[ndx].format) << ", "
								<< m_fboSpec[ndx].width << "x" << m_fboSpec[ndx].height << ", "
								<< m_fboSpec[ndx].samples << " samples"
			<< TestLog::EndMessage;

	log << TestLog::EndSection;

	// Create framebuffer.
	m_renderbuffers.resize(m_fboSpec.size(), 0);
	gl.genFramebuffers(1, &m_framebuffer);
	gl.genRenderbuffers((int)m_renderbuffers.size(), &m_renderbuffers[0]);

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);

	for (int bufNdx = 0; bufNdx < (int)m_renderbuffers.size(); bufNdx++)
	{
		deUint32			rbo			= m_renderbuffers[bufNdx];
		const BufferSpec&	bufSpec		= m_fboSpec[bufNdx];
		deUint32			attachment	= GL_COLOR_ATTACHMENT0+bufNdx;

		gl.bindRenderbuffer(GL_RENDERBUFFER, rbo);
		gl.renderbufferStorageMultisample(GL_RENDERBUFFER, bufSpec.samples, bufSpec.format, bufSpec.width, bufSpec.height);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, attachment, GL_RENDERBUFFER, rbo);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "After framebuffer setup");

	deUint32 fboStatus = gl.checkFramebufferStatus(GL_FRAMEBUFFER);
	if (fboStatus == GL_FRAMEBUFFER_UNSUPPORTED)
		throw tcu::NotSupportedError("Framebuffer not supported", "", __FILE__, __LINE__);
	else if (fboStatus != GL_FRAMEBUFFER_COMPLETE)
		throw tcu::TestError((string("Incomplete framebuffer: ") + glu::getFramebufferStatusStr(fboStatus).toString()).c_str(), "", __FILE__, __LINE__);

	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "After init");
}